

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  time_t tVar2;
  int *piVar3;
  ostream *poVar4;
  char *__s;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  string tempDir;
  Rand48 rand48;
  string local_60;
  char **local_40;
  ushort local_36;
  undefined2 local_34;
  ushort local_32;
  
  local_40 = argv;
  tVar2 = time((time_t *)0x0);
  uVar6 = tVar2 * 0xa5a573a5 ^ 0x5a5a5a5a;
  local_36 = (ushort)uVar6;
  local_34 = (undefined2)(uVar6 >> 0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_32 = local_36;
  while( true ) {
    std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)local_60._M_string_length,0x10f004);
    iVar7 = 8;
    do {
      Imath_3_2::nrand48(&local_36);
      std::__cxx11::string::push_back((char)&local_60);
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    iVar7 = mkdir(local_60._M_dataplus._M_p,0x1ff);
    if (iVar7 == 0) break;
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot create directory ",0x18);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,". ",2);
      __s = strerror(*piVar3);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
      }
      else {
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      iVar7 = 1;
      std::ostream::flush();
LAB_00104b9a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      return iVar7;
    }
  }
  std::__cxx11::string::append((char *)&local_60);
  ppcVar1 = local_40;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"using temporary directory ",0x1a);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (argc < 2) {
LAB_00104a9f:
    testFlatImage(&local_60);
  }
  else {
    iVar7 = strcmp(ppcVar1[1],"testFlatImage");
    if (iVar7 == 0) goto LAB_00104a9f;
  }
  if (argc < 2) {
LAB_00104ac2:
    testDeepImage(&local_60);
  }
  else {
    iVar7 = strcmp(ppcVar1[1],"testDeepImage");
    if (iVar7 == 0) goto LAB_00104ac2;
  }
  if (argc < 2) {
LAB_00104ae5:
    testIO(&local_60);
  }
  else {
    iVar7 = strcmp(ppcVar1[1],"testIO");
    if (iVar7 == 0) goto LAB_00104ae5;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"removing temporary directory ",0x1d);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  rmdir(local_60._M_dataplus._M_p);
  iVar7 = 0;
  goto LAB_00104b9a;
}

Assistant:

int
main (int argc, char* argv[])
{
    //
    // Create temporary files in a uniquely named private temporary
    // subdirectory of IMF_TMP_DIR to avoid colliding with other running
    // instances of this program.
    //

    IMATH_NAMESPACE::Rand48 rand48 (time ((time_t*) 0));
    std::string             tempDir;

    while (true)
    {
#ifdef _WIN32
        char  tmpbuf[4096];
        DWORD len = GetTempPathA (4096, tmpbuf);
        if (len == 0 || len > 4095)
        {
            cerr << "Cannot retrieve temporary directory" << endl;
            return 1;
        }
        tempDir = tmpbuf;
        // windows does this automatically
        // tempDir += IMF_PATH_SEPARATOR;
        tempDir += "OpenEXRTest_";
#else
        tempDir = IMF_TMP_DIR "OpenEXRTest_";
#endif
        for (int i = 0; i < 8; ++i)
            tempDir += ('A' + rand48.nexti () % 26);

        if (mkdir (tempDir.c_str (), 0777) == 0)
        {
            tempDir += IMF_PATH_SEPARATOR;
            break; // success
        }

        if (errno != EEXIST)
        {
            cerr << "Cannot create directory " << tempDir << ". "
                 << strerror (errno) << endl;

            return 1;
        }
    }

    cout << "using temporary directory " << tempDir << endl;

    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite
    TEST (testFlatImage);
    TEST (testDeepImage);
    TEST (testIO);
    // NB: If you add a test here, make sure to enumerate it in the
    // CMakeLists.txt so it runs as part of the test suite

    cout << "removing temporary directory " << tempDir << endl;
    rmdir (tempDir.c_str ());

    return 0;
}